

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::insert_frame(QTextDocumentPrivate *this,QTextFrame *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QTextFrame *pQVar4;
  QTextFramePrivate *pQVar5;
  qsizetype qVar6;
  QList<QTextFrame_*> *this_00;
  QList<QTextFrame_*> *in_RSI;
  QTextFrame *c_1;
  int i;
  QTextFrame *c;
  int i_1;
  QTextFrame *parent;
  int end;
  int start;
  QTextFrame *in_stack_ffffffffffffff88;
  QList<QTextFrame_*> *in_stack_ffffffffffffff90;
  QList<QTextFrame_*> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa4;
  parameter_type in_stack_ffffffffffffffa8;
  int local_34;
  int local_24;
  
  iVar1 = QTextFrame::firstPosition(in_stack_ffffffffffffff88);
  iVar2 = QTextFrame::lastPosition(in_stack_ffffffffffffff88);
  pQVar4 = frameAt((QTextDocumentPrivate *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (iVar1 != iVar2) {
    local_24 = 0;
    while( true ) {
      in_stack_ffffffffffffffa8 = (parameter_type)(long)local_24;
      pQVar5 = QTextFrame::d_func((QTextFrame *)0x7d6d98);
      qVar6 = QList<QTextFrame_*>::size(&pQVar5->childFrames);
      if (qVar6 <= (long)in_stack_ffffffffffffffa8) break;
      QTextFrame::d_func((QTextFrame *)0x7d6dc2);
      QList<QTextFrame_*>::at(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
      iVar7 = iVar1;
      iVar3 = QTextFrame::firstPosition(in_stack_ffffffffffffff88);
      if ((iVar7 < iVar3) &&
         (iVar7 = iVar2, iVar3 = QTextFrame::lastPosition(in_stack_ffffffffffffff88), iVar3 < iVar7)
         ) {
        QTextFrame::d_func((QTextFrame *)0x7d6e20);
        QList<QTextFrame_*>::removeAt
                  (in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
        QTextFrame::d_func((QTextFrame *)0x7d6e3e);
        QList<QTextFrame_*>::append((QList<QTextFrame_*> *)0x7d6e52,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff98 = in_RSI;
        pQVar5 = QTextFrame::d_func((QTextFrame *)0x7d6e66);
        pQVar5->parentFrame = (QTextFrame *)in_stack_ffffffffffffff98;
      }
      local_24 = local_24 + 1;
    }
  }
  local_34 = 0;
  while( true ) {
    this_00 = (QList<QTextFrame_*> *)(long)local_34;
    pQVar5 = QTextFrame::d_func((QTextFrame *)0x7d6ea2);
    qVar6 = QList<QTextFrame_*>::size(&pQVar5->childFrames);
    if (qVar6 <= (long)this_00) break;
    QTextFrame::d_func((QTextFrame *)0x7d6ec8);
    QList<QTextFrame_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff88);
    iVar1 = QTextFrame::firstPosition(in_stack_ffffffffffffff88);
    if (iVar2 < iVar1) break;
    local_34 = local_34 + 1;
  }
  QTextFrame::d_func((QTextFrame *)0x7d6f0f);
  QList<QTextFrame_*>::insert
            (in_stack_ffffffffffffff98,(qsizetype)this_00,in_stack_ffffffffffffffa8);
  pQVar5 = QTextFrame::d_func((QTextFrame *)0x7d6f40);
  pQVar5->parentFrame = pQVar4;
  return;
}

Assistant:

void QTextDocumentPrivate::insert_frame(QTextFrame *f)
{
    int start = f->firstPosition();
    int end = f->lastPosition();
    QTextFrame *parent = frameAt(start-1);
    Q_ASSERT(parent == frameAt(end+1));

    if (start != end) {
        // iterator over the parent and move all children contained in my frame to myself
        for (int i = 0; i < parent->d_func()->childFrames.size(); ++i) {
            QTextFrame *c = parent->d_func()->childFrames.at(i);
            if (start < c->firstPosition() && end > c->lastPosition()) {
                parent->d_func()->childFrames.removeAt(i);
                f->d_func()->childFrames.append(c);
                c->d_func()->parentFrame = f;
            }
        }
    }
    // insert at the correct position
    int i = 0;
    for (; i < parent->d_func()->childFrames.size(); ++i) {
        QTextFrame *c = parent->d_func()->childFrames.at(i);
        if (c->firstPosition() > end)
            break;
    }
    parent->d_func()->childFrames.insert(i, f);
    f->d_func()->parentFrame = parent;
}